

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O1

void nsync_maybe_merge_conditions_(nsync_dll_element_ *p,nsync_dll_element_ *n)

{
  void *pvVar1;
  int iVar2;
  
  if (n != (nsync_dll_element_ *)0x0 && p != (nsync_dll_element_ *)0x0) {
    pvVar1 = p->container;
    if ((*(long *)((long)pvVar1 + 0x50) != 0) &&
       (*(long *)((long)pvVar1 + 0x50) == *(long *)((long)n->container + 0x50))) {
      if (*(long *)((long)pvVar1 + 0x58) == *(long *)((long)n->container + 0x58)) {
LAB_00106188:
        nsync_dll_splice_after_
                  ((nsync_dll_element_ *)((long)p->container + 0x68),
                   (nsync_dll_element_ *)((long)n->container + 0x68));
        return;
      }
      if (*(code **)((long)pvVar1 + 0x60) != (code *)0x0) {
        iVar2 = (**(code **)((long)pvVar1 + 0x60))();
        if (iVar2 != 0) goto LAB_00106188;
      }
    }
  }
  return;
}

Assistant:

void nsync_maybe_merge_conditions_ (nsync_dll_element_ *p, nsync_dll_element_ *n) {
	if (p != NULL && n != NULL &&
	    WAIT_CONDITION_EQ (&DLL_WAITER (p)->cond, &DLL_WAITER (n)->cond)) {
		nsync_dll_splice_after_ (&DLL_WAITER (p)->same_condition,
				  &DLL_WAITER (n)->same_condition);
	}
}